

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppix_manager.c
# Opt level: O1

int write_ppix(int coff,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,opj_cio_t *cio)

{
  int v;
  OPJ_UINT32 OVar1;
  int pos;
  opj_jp2_box_t *box;
  long lVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  opj_codestream_info_t *poVar4;
  double *pdVar5;
  ulong uVar6;
  int second;
  OPJ_UINT32 *pOVar7;
  ulong uVar8;
  bool bVar9;
  byte bVar10;
  opj_codestream_info_t in_stack_ffffffffffffff38;
  int local_4c;
  
  v = cstr_info.numcomps;
  bVar10 = 0;
  uVar8 = (ulong)(uint)cstr_info.numcomps;
  box = (opj_jp2_box_t *)calloc((long)cstr_info.numcomps,0xc);
  local_4c = -1;
  second = 0;
  do {
    if (second != 0) {
      cio_seek(cio,local_4c);
    }
    local_4c = cio_tell(cio);
    cio_skip(cio,4);
    cio_write(cio,0x70706978,4);
    write_manf(second,v,box,cio);
    if (0 < v) {
      uVar6 = 0;
      uVar3 = extraout_RDX;
      pOVar7 = &box->type;
      do {
        poVar4 = &cstr_info;
        pdVar5 = (double *)&stack0xffffffffffffff38;
        for (lVar2 = 0xe; lVar2 != 0; lVar2 = lVar2 + -1) {
          *pdVar5 = poVar4->D_max;
          poVar4 = (opj_codestream_info_t *)((long)poVar4 + (ulong)bVar10 * -0x10 + 8);
          pdVar5 = pdVar5 + (ulong)bVar10 * -2 + 1;
        }
        OVar1 = write_ppixfaix(coff,(int)uVar6,in_stack_ffffffffffffff38,(opj_bool)uVar3,0,cio);
        ((opj_jp2_box_t *)(pOVar7 + -1))->length = OVar1;
        *pOVar7 = 0x66616978;
        uVar6 = uVar6 + 1;
        pOVar7 = pOVar7 + 3;
        uVar3 = extraout_RDX_00;
      } while (uVar8 != uVar6);
    }
    pos = cio_tell(cio);
    cio_seek(cio,local_4c);
    cio_write(cio,(long)(pos - local_4c),4);
    cio_seek(cio,pos);
    bVar9 = second == 0;
    second = second + 1;
  } while (bVar9);
  free(box);
  return pos - local_4c;
}

Assistant:

int write_ppix( int coff, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp, compno, i;
  opj_jp2_box_t *box;

  /*  printf("cstr_info.packno %d\n", cstr_info.packno); //NMAX? */

  lenp = -1;
  box = (opj_jp2_box_t *)opj_calloc( cstr_info.numcomps, sizeof(opj_jp2_box_t));
  
  for (i=0;i<2;i++){
    if (i) cio_seek( cio, lenp);
    
    lenp = cio_tell( cio);
    cio_skip( cio, 4);              /* L [at the end] */
    cio_write( cio, JPIP_PPIX, 4);  /* PPIX           */

    write_manf( i, cstr_info.numcomps, box, cio);
    
    for (compno=0; compno<cstr_info.numcomps; compno++){
      box[compno].length = write_ppixfaix( coff, compno, cstr_info, EPHused, j2klen, cio);
      box[compno].type = JPIP_FAIX;
    }
   
    len = cio_tell( cio)-lenp;
    cio_seek( cio, lenp);
    cio_write( cio, len, 4);        /* L              */
    cio_seek( cio, lenp+len);
  }
  
  opj_free(box);

  return len;
}